

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O3

double __thiscall Polynomial::func(Polynomial *this,double x)

{
  uint uVar1;
  int iVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar3;
  double dVar4;
  
  iVar2 = (this->super_PolynomialFit).degree;
  if ((this->super_PolynomialFit).isIntercedeEnable == false) {
    dVar4 = 0.0;
    if (-1 < iVar2) {
      uVar1 = 0xffffffff;
      iVar2 = 0;
      do {
        uVar1 = uVar1 + 1;
        (*(this->super_PolynomialFit)._vptr_PolynomialFit[1])(this,(ulong)uVar1);
        dVar3 = pow(x,(double)((this->super_PolynomialFit).degree + iVar2));
        dVar4 = dVar4 + dVar3 * (double)extraout_XMM0_Da_00;
        iVar2 = iVar2 + -1;
      } while ((int)uVar1 < (this->super_PolynomialFit).degree);
    }
  }
  else {
    dVar4 = 0.0;
    if (0 < iVar2) {
      iVar2 = 0;
      uVar1 = 0;
      do {
        (*(this->super_PolynomialFit)._vptr_PolynomialFit[1])(this,(ulong)uVar1);
        dVar3 = pow(x,(double)((this->super_PolynomialFit).degree + iVar2));
        dVar4 = dVar4 + dVar3 * (double)extraout_XMM0_Da;
        uVar1 = uVar1 + 1;
        iVar2 = iVar2 + -1;
      } while ((int)uVar1 < (this->super_PolynomialFit).degree);
    }
    dVar4 = dVar4 + (this->super_PolynomialFit).intercede;
  }
  return dVar4;
}

Assistant:

double Polynomial::func(double x)
{
    double result = 0;
    if(!isIntercedeEnable){
        for(int i(0) ; i<=degree ; i++)
        {
            result += getResult(i)*pow(x , degree-i);
        }
    }else{
        for(int i(0) ; i<degree ; i++)
        {
            result += getResult(i)*pow(x , degree-i);
        }
        result += intercede;
    }

    return result;
}